

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneField
          (MessageGenerator *this,Printer *printer,FieldDescriptor *field,bool to_array,
          int cached_has_bits_index)

{
  bool bVar1;
  FieldOptions *pFVar2;
  FileDescriptor *pFVar3;
  char *pcVar4;
  reference pvVar5;
  FieldGenerator *pFVar6;
  int __c;
  Printer *__s;
  Hex hex;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  undefined1 local_90 [12];
  AlphaNum local_80;
  undefined1 local_50 [8];
  string mask;
  int has_bit_index;
  bool have_enclosing_if;
  int cached_has_bits_index_local;
  bool to_array_local;
  FieldDescriptor *field_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  AlphaNum *a;
  
  __s = printer;
  pFVar2 = FieldDescriptor::options(field);
  bVar1 = FieldOptions::weak(pFVar2);
  if (!bVar1) {
    __s = (Printer *)field;
    anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,field);
  }
  mask.field_2._M_local_buf[0xf] = '\0';
  pFVar2 = FieldDescriptor::options(field);
  bVar1 = FieldOptions::weak(pFVar2);
  if (!bVar1) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (!bVar1) {
      pFVar3 = Descriptor::file(this->descriptor_);
      bVar1 = HasFieldPresence(pFVar3);
      if (bVar1) {
        pcVar4 = FieldDescriptor::index(field,&__s->variable_delimiter_,__c);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->has_bit_indices_,(long)(int)pcVar4);
        mask.field_2._8_4_ = *pvVar5;
        if (cached_has_bits_index == (int)mask.field_2._8_4_ / 0x20) {
          strings::Hex::Hex<unsigned_int>
                    ((Hex *)local_90,1 << ((byte)mask.field_2._8_4_ & 0x1f),ZERO_PAD_8);
          hex._12_4_ = 0;
          hex.value = local_90._0_8_;
          hex.spec = local_90._8_4_;
          strings::AlphaNum::AlphaNum(&local_80,hex);
          StrCat_abi_cxx11_((string *)local_50,(protobuf *)&local_80,a);
          io::Printer::Print(printer,"if (cached_has_bits & 0x$mask$u) {\n","mask",
                             (string *)local_50);
          std::__cxx11::string::~string((string *)local_50);
        }
        else {
          FieldName_abi_cxx11_
                    (&local_c0,(cpp *)field,
                     (FieldDescriptor *)((long)(int)mask.field_2._8_4_ % 0x20 & 0xffffffff));
          io::Printer::Print(printer,"if (has_$name$()) {\n","name",&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
        }
        io::Printer::Indent(printer);
        mask.field_2._M_local_buf[0xf] = '\x01';
        goto LAB_003fad21;
      }
    }
    pFVar3 = Descriptor::file(this->descriptor_);
    bVar1 = HasFieldPresence(pFVar3);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"this->",&local_e1);
      mask.field_2._M_local_buf[0xf] =
           anon_unknown_0::EmitFieldNonDefaultCondition(printer,&local_e0,field);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
    }
  }
LAB_003fad21:
  if (to_array) {
    pFVar6 = FieldGeneratorMap::get(&this->field_generators_,field);
    (*pFVar6->_vptr_FieldGenerator[0x16])(pFVar6,printer);
  }
  else {
    pFVar6 = FieldGeneratorMap::get(&this->field_generators_,field);
    (*pFVar6->_vptr_FieldGenerator[0x15])(pFVar6,printer);
  }
  if ((mask.field_2._M_local_buf[0xf] & 1U) != 0) {
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  io::Printer::Print(printer,"\n");
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneField(
    io::Printer* printer, const FieldDescriptor* field, bool to_array,
    int cached_has_bits_index) {
  if (!field->options().weak()) {
    // For weakfields, PrintFieldComment is called during iteration.
    PrintFieldComment(printer, field);
  }

  bool have_enclosing_if = false;
  if (field->options().weak()) {
  } else if (!field->is_repeated() && HasFieldPresence(descriptor_->file())) {
    // Attempt to use the state of cached_has_bits, if possible.
    int has_bit_index = has_bit_indices_[field->index()];
    if (cached_has_bits_index == has_bit_index / 32) {
      const string mask = StrCat(
          strings::Hex(1u << (has_bit_index % 32),
          strings::ZERO_PAD_8));

      printer->Print(
          "if (cached_has_bits & 0x$mask$u) {\n", "mask", mask);
    } else {
      printer->Print(
        "if (has_$name$()) {\n",
        "name", FieldName(field));
    }

    printer->Indent();
    have_enclosing_if = true;
  } else if (!HasFieldPresence(descriptor_->file())) {
    have_enclosing_if = EmitFieldNonDefaultCondition(printer, "this->", field);
  }

  if (to_array) {
    field_generators_.get(field).GenerateSerializeWithCachedSizesToArray(
        printer);
  } else {
    field_generators_.get(field).GenerateSerializeWithCachedSizes(printer);
  }

  if (have_enclosing_if) {
    printer->Outdent();
    printer->Print("}\n");
  }
  printer->Print("\n");
}